

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
* __thiscall
xmotion::utils::
ReconstructPath<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>
          (vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           *__return_storage_ptr__,utils *this,vertex_iterator start_vtx,vertex_iterator goal_vtx)

{
  pointer *ppvVar1;
  iterator iVar2;
  pointer pvVar3;
  __node_type *p_Var4;
  pointer pvVar5;
  pointer pvVar6;
  vertex_iterator waypoint;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._M_cur =
       (__node_type *)
       start_vtx.super_const_vertex_iterator.super_VertexMapTypeIterator.
       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
       ._M_cur;
  if (start_vtx.super_const_vertex_iterator.super_VertexMapTypeIterator.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (const_vertex_iterator)this) {
    do {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>
        ::
        _M_realloc_insert<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator_const&>
                  ((vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>
                    *)__return_storage_ptr__,iVar2,(vertex_iterator *)&local_20);
      }
      else {
        ((iVar2._M_current)->super_const_vertex_iterator).super_VertexMapTypeIterator.
        super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
        ._M_cur = local_20._M_cur;
        ppvVar1 = &(__return_storage_ptr__->
                   super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      local_20._M_cur =
           *(__node_type **)
            (*(long *)((long)&((local_20._M_cur)->
                              super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>
                              ._M_storage._M_storage + 8) + 0x68);
    } while (local_20._M_cur != (__node_type *)this);
  }
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>
    ::
    _M_realloc_insert<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator_const&>
              ((vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>
                *)__return_storage_ptr__,iVar2,(vertex_iterator *)&local_20);
  }
  else {
    ((iVar2._M_current)->super_const_vertex_iterator).super_VertexMapTypeIterator.
    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
    ._M_cur = local_20._M_cur;
    ppvVar1 = &(__return_storage_ptr__->
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppvVar1 = *ppvVar1 + 1;
  }
  pvVar3 = (__return_storage_ptr__->
           super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (__return_storage_ptr__->
           super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = pvVar5 + -1;
  if (pvVar3 < pvVar6 && pvVar3 != pvVar5) {
    do {
      pvVar5 = pvVar3 + 1;
      p_Var4 = (pvVar3->super_const_vertex_iterator).super_VertexMapTypeIterator.
               super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
               ._M_cur;
      (pvVar3->super_const_vertex_iterator).super_VertexMapTypeIterator.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur = (pvVar6->super_const_vertex_iterator).super_VertexMapTypeIterator.
                super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                ._M_cur;
      (pvVar6->super_const_vertex_iterator).super_VertexMapTypeIterator.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur = p_Var4;
      pvVar6 = pvVar6 + -1;
      pvVar3 = pvVar5;
    } while (pvVar5 < pvVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<VertexIterator> ReconstructPath(VertexIterator start_vtx,
                                                   VertexIterator goal_vtx) {
  std::vector<VertexIterator> path;
  VertexIterator waypoint = goal_vtx;
  while (waypoint != start_vtx) {
    path.push_back(waypoint);
    waypoint = waypoint->search_parent;
  }
  // add the start node
  path.push_back(waypoint);
  std::reverse(path.begin(), path.end());
#ifndef MINIMAL_PRINTOUT
  auto traj_s = path.begin();
  auto traj_e = path.end() - 1;
  std::cout << "starting vertex id: " << (*traj_s)->vertex_id_ << std::endl;
  std::cout << "finishing vertex id: " << (*traj_e)->vertex_id_ << std::endl;
  std::cout << "path length: " << path.size() << std::endl;
  std::cout << "total cost: " << path.back()->g_cost << std::endl;
#endif
  return path;
}